

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

iterator divsufsortxx::helper::
         median5<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                   (iterator Td,iterator v1,iterator v2,iterator v3,iterator v4,iterator v5)

{
  iterator iVar1;
  long lVar2;
  long lVar3;
  iterator *this;
  iterator *__b;
  BitmapArray<long> *in_stack_00000008;
  pos_type in_stack_00000010;
  BitmapArray<long> *in_stack_00000018;
  pos_type in_stack_00000020;
  iterator *in_stack_fffffffffffffe08;
  iterator *in_stack_fffffffffffffe10;
  undefined8 local_10;
  undefined8 local_8;
  
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12835b);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128378);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_fffffffffffffe10,(difference_type)in_stack_fffffffffffffe08);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1283a5);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1283b4);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1283d1);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_fffffffffffffe10,(difference_type)in_stack_fffffffffffffe08);
  lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1283fe);
  if (lVar3 < lVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x128427);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128444);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_fffffffffffffe10,(difference_type)in_stack_fffffffffffffe08);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128471);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x128480);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12849d);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_fffffffffffffe10,(difference_type)in_stack_fffffffffffffe08);
  lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1284ca);
  if (lVar3 < lVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1284f3);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128510);
  bitmap::BitmapArray<long>::iterator::operator[]
            (in_stack_fffffffffffffe10,(difference_type)in_stack_fffffffffffffe08);
  this = (iterator *)
         bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12853d);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12854c);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128569);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)in_stack_fffffffffffffe08);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128596);
  if (lVar2 < (long)this) {
    std::swap<bitmap::BitmapArray<long>::iterator>(this,in_stack_fffffffffffffe08);
    std::swap<bitmap::BitmapArray<long>::iterator>(this,in_stack_fffffffffffffe08);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1285d1);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1285ee);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)in_stack_fffffffffffffe08);
  __b = (iterator *)
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12861b);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12862a);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128647);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)__b);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128674);
  if (lVar2 < (long)__b) {
    std::swap<bitmap::BitmapArray<long>::iterator>(this,__b);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1286a0);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1286bd);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)__b);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1286ea);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1286f9);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128716);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)__b);
  lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x128743);
  if (lVar3 < lVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>(this,__b);
    std::swap<bitmap::BitmapArray<long>::iterator>(this,__b);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12877b);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12878f);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)__b);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1287b6);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1287c4);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1287d8);
  bitmap::BitmapArray<long>::iterator::operator[](this,(difference_type)__b);
  lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x1287fc);
  if (lVar3 < lVar2) {
    local_10 = in_stack_00000018;
    local_8 = in_stack_00000020;
  }
  else {
    local_10 = in_stack_00000008;
    local_8 = in_stack_00000010;
  }
  iVar1.pos_ = local_8;
  iVar1.array_ = local_10;
  return iVar1;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}